

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

string_view __thiscall
google::protobuf::Reflection::GetStringView
          (Reflection *this,Message *message,FieldDescriptor *field,ScratchSpace *scratch)

{
  void *pvVar1;
  bool bVar2;
  CppStringType CVar3;
  uint32_t uVar4;
  OneofDescriptor *pOVar5;
  Cord **ppCVar6;
  ArenaStringPtr *pAVar7;
  string *psVar8;
  Cord *cord;
  char *description;
  Descriptor *expected;
  Metadata MVar9;
  string_view sVar10;
  
  MVar9 = Message::GetMetadata(message);
  if (MVar9.reflection == this) {
    expected = this->descriptor_;
    if (field->containing_type_ == expected) {
      if (0xbf < (byte)field->field_0x1) {
        description = "Field is repeated; the method requires a singular field.";
        goto LAB_0024c489;
      }
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 9) {
        anon_unknown_6::ReportReflectionUsageTypeError
                  (expected,field,"GetStringView",CPPTYPE_STRING);
      }
      if ((field->field_0x1 & 8) != 0) {
        uVar4 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
        psVar8 = internal::ExtensionSet::GetString
                           ((ExtensionSet *)
                            ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),
                            field->number_,(field->field_22).default_value_string_);
        goto LAB_0024c41c;
      }
      pOVar5 = FieldDescriptor::real_containing_oneof(field);
      if (pOVar5 == (OneofDescriptor *)0x0) {
LAB_0024c3ae:
        CVar3 = FieldDescriptor::cpp_string_type(field);
        if (CVar3 == kCord) {
          pOVar5 = FieldDescriptor::real_containing_oneof(field);
          if (pOVar5 == (OneofDescriptor *)0x0) {
            cord = GetRaw<absl::lts_20240722::Cord>(this,message,field);
          }
          else {
            ppCVar6 = GetRaw<absl::lts_20240722::Cord*>(this,message,field);
            cord = *ppCVar6;
          }
          sVar10 = ScratchSpace::CopyFromCord(scratch,cord);
          return sVar10;
        }
        pAVar7 = GetRaw<google::protobuf::internal::ArenaStringPtr>(this,message,field);
        pvVar1 = (pAVar7->tagged_ptr_).ptr_;
        if (((ulong)pvVar1 & 3) != 0) {
          psVar8 = (string *)((ulong)pvVar1 & 0xfffffffffffffffc);
          goto LAB_0024c41c;
        }
      }
      else {
        bVar2 = HasOneofField(this,message,field);
        if (bVar2) goto LAB_0024c3ae;
      }
      psVar8 = (field->field_22).default_value_string_;
LAB_0024c41c:
      sVar10._M_str = (psVar8->_M_dataplus)._M_p;
      sVar10._M_len = psVar8->_M_string_length;
      return sVar10;
    }
  }
  else {
    expected = this->descriptor_;
    MVar9 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (expected,MVar9.descriptor,field,"GetStringView");
  }
  description = "Field does not match message type.";
LAB_0024c489:
  anon_unknown_6::ReportReflectionUsageError(expected,field,"GetStringView",description);
}

Assistant:

absl::string_view Reflection::GetStringView(const Message& message,
                                            const FieldDescriptor* field,
                                            ScratchSpace& scratch) const {
  USAGE_CHECK_ALL(GetStringView, SINGULAR, STRING);

  if (field->is_extension()) {
    return GetExtensionSet(message).GetString(
        field->number(), internal::DefaultValueStringAsString(field));
  }
  if (schema_.InRealOneof(field) && !HasOneofField(message, field)) {
    return field->default_value_string();
  }

  switch (field->cpp_string_type()) {
    case FieldDescriptor::CppStringType::kCord: {
      const auto& cord = schema_.InRealOneof(field)
                             ? *GetField<absl::Cord*>(message, field)
                             : GetField<absl::Cord>(message, field);
      return scratch.CopyFromCord(cord);
    }
    default:
      auto str = GetField<ArenaStringPtr>(message, field);
      return str.IsDefault() ? field->default_value_string() : str.Get();
  }
}